

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  bool condition;
  mapped_type *this_00;
  pool_ptr<soul::heart::ProcessorInstance> local_48 [3];
  pool_ref<const_soul::heart::ProcessorInstance> local_30;
  mapped_type *local_28;
  mapped_type *mapping;
  ProcessorInstance *p;
  ProcessorInstance *old_local;
  ModuleCloner *this_local;
  
  p = (ProcessorInstance *)__fn;
  old_local = (ProcessorInstance *)this;
  mapping = (mapped_type *)
            Module::allocate<soul::heart::ProcessorInstance,soul::CodeLocation_const&>
                      (this->newModule,(CodeLocation *)(__fn + 8));
  pool_ref<soul::heart::ProcessorInstance_const>::
  pool_ref<soul::heart::ProcessorInstance_const,void>
            ((pool_ref<soul::heart::ProcessorInstance_const> *)&local_30,p);
  this_00 = std::
            unordered_map<soul::pool_ref<const_soul::heart::ProcessorInstance>,_soul::pool_ptr<soul::heart::ProcessorInstance>,_std::hash<soul::pool_ref<const_soul::heart::ProcessorInstance>_>,_std::equal_to<soul::pool_ref<const_soul::heart::ProcessorInstance>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::ProcessorInstance>,_soul::pool_ptr<soul::heart::ProcessorInstance>_>_>_>
            ::operator[](&this->processorInstanceMappings,(key_type *)&local_30);
  pool_ref<const_soul::heart::ProcessorInstance>::~pool_ref(&local_30);
  local_28 = this_00;
  condition = pool_ptr<soul::heart::ProcessorInstance>::operator==(this_00,(void *)0x0);
  checkAssertion(condition,"mapping == nullptr","clone",0xe8);
  pool_ptr<soul::heart::ProcessorInstance>::pool_ptr<soul::heart::ProcessorInstance,void>
            (local_48,(ProcessorInstance *)mapping);
  local_28->object = local_48[0].object;
  pool_ptr<soul::heart::ProcessorInstance>::~pool_ptr(local_48);
  std::__cxx11::string::operator=((string *)(mapping + 3),(string *)&p->instanceName);
  std::__cxx11::string::operator=((string *)(mapping + 7),(string *)&p->sourceName);
  mapping[0xe].object =
       (ProcessorInstance *)
       (p->clockMultiplier).multiplier.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._M_payload;
  mapping[0xf].object =
       *(ProcessorInstance **)
        &(p->clockMultiplier).multiplier.super__Optional_base<long,_true,_true>._M_payload.
         super__Optional_payload_base<long>._M_engaged;
  mapping[0x10].object =
       (ProcessorInstance *)
       (p->clockMultiplier).divider.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._M_payload;
  mapping[0x11].object =
       *(ProcessorInstance **)
        &(p->clockMultiplier).divider.super__Optional_base<long,_true,_true>._M_payload.
         super__Optional_payload_base<long>._M_engaged;
  *(uint32_t *)&mapping[0xb].object = p->arraySize;
  return (int)mapping;
}

Assistant:

heart::ProcessorInstance& clone (const heart::ProcessorInstance& old)
    {
        auto& p = newModule.allocate<heart::ProcessorInstance> (old.location);
        auto& mapping = processorInstanceMappings[old];
        SOUL_ASSERT (mapping == nullptr);
        mapping = p;
        p.instanceName = old.instanceName;
        p.sourceName = old.sourceName;
        p.clockMultiplier = old.clockMultiplier;
        p.arraySize = old.arraySize;
        return p;
    }